

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.H
# Opt level: O3

void __thiscall
amrex::AmrLevel::set_state_in_checkpoint(AmrLevel *this,Vector<int,_std::allocator<int>_> *param_1)

{
  Error_host("Class derived AmrLevel has to handle this!");
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_FORCE_INLINE
    void Error (const char* msg = 0) {
#if AMREX_DEVICE_COMPILE
#if defined(NDEBUG)
        amrex::ignore_unused(msg);
#else
        if (msg) AMREX_DEVICE_PRINTF("Error %s\n", msg);
        AMREX_DEVICE_ASSERT(0);
#endif
#else
        Error_host(msg);
#endif
    }